

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

Iterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::Erase(Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
        *this,ConstIterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> from,
       ConstIterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> to)

{
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> destroy_size;
  long lVar1;
  ulong uVar2;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar3;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_std::move_iterator<absl::lts_20250127::status_internal::Payload_*>_>
  move_values;
  
  uVar2 = (this->metadata_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if ((uVar2 & 1) == 0) {
    pPVar3 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)&this->data_;
  }
  else {
    pPVar3 = (this->data_).allocated.allocated_data;
  }
  uVar2 = uVar2 >> 1;
  destroy_size = ((long)to - (long)from) / 0x30;
  lVar1 = ((long)from - (long)pPVar3) / 0x30 + destroy_size;
  move_values.it_._M_current =
       (move_iterator<absl::lts_20250127::status_internal::Payload_*>)(pPVar3 + lVar1);
  AssignElements<std::allocator<absl::lts_20250127::status_internal::Payload>,absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,std::move_iterator<absl::lts_20250127::status_internal::Payload*>>>
            (from,&move_values,uVar2 - lVar1);
  DestroyAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_false>::
  DestroyElements((allocator<absl::lts_20250127::status_internal::Payload> *)this,
                  pPVar3 + (uVar2 - destroy_size),destroy_size);
  SubtractSize(this,destroy_size);
  return from;
}

Assistant:

auto Storage<T, N, A>::Erase(ConstIterator<A> from,
                             ConstIterator<A> to) -> Iterator<A> {
  StorageView<A> storage_view = MakeStorageView();

  auto erase_size = static_cast<SizeType<A>>(std::distance(from, to));
  auto erase_index = static_cast<SizeType<A>>(
      std::distance(ConstIterator<A>(storage_view.data), from));
  SizeType<A> erase_end_index = erase_index + erase_size;

  // Fast path: if the value type is trivially relocatable and we know
  // the allocator doesn't do anything fancy, then we know it is legal for us to
  // simply destroy the elements in the "erasure window" (which cannot throw)
  // and then memcpy downward to close the window.
  if (absl::is_trivially_relocatable<ValueType<A>>::value &&
      std::is_nothrow_destructible<ValueType<A>>::value &&
      std::is_same<A, std::allocator<ValueType<A>>>::value) {
    DestroyAdapter<A>::DestroyElements(
        GetAllocator(), storage_view.data + erase_index, erase_size);
    std::memmove(
        reinterpret_cast<char*>(storage_view.data + erase_index),
        reinterpret_cast<const char*>(storage_view.data + erase_end_index),
        (storage_view.size - erase_end_index) * sizeof(ValueType<A>));
  } else {
    IteratorValueAdapter<A, MoveIterator<A>> move_values(
        MoveIterator<A>(storage_view.data + erase_end_index));

    AssignElements<A>(storage_view.data + erase_index, move_values,
                      storage_view.size - erase_end_index);

    DestroyAdapter<A>::DestroyElements(
        GetAllocator(), storage_view.data + (storage_view.size - erase_size),
        erase_size);
  }
  SubtractSize(erase_size);
  return Iterator<A>(storage_view.data + erase_index);
}